

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O1

void __thiscall
t_xsd_generator::generate_element
          (t_xsd_generator *this,ostream *out,string *name,t_type *ttype,t_struct *attrs,
          bool optional,bool nillable,bool list_element)

{
  int *piVar1;
  t_type *ttype_00;
  pointer pcVar2;
  t_program *ptVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer pptVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  string subname;
  string snillable;
  string soptional;
  string local_b0;
  string smaxOccurs;
  string sminOccurs;
  string local_50;
  
  pcVar11 = "";
  pcVar10 = " maxOccurs=\"unbounded\"";
  if (!list_element) {
    pcVar10 = "";
  }
  pcVar9 = " minOccurs=\"0\"";
  pcVar8 = pcVar10 + 0x16;
  if (!list_element) {
    pcVar8 = pcVar10;
  }
  if (!optional && !list_element) {
    pcVar9 = "";
  }
  sminOccurs._M_dataplus._M_p = (pointer)&sminOccurs.field_2;
  pcVar6 = pcVar9 + 0xe;
  if (!optional && !list_element) {
    pcVar6 = pcVar9;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&sminOccurs,pcVar9,pcVar6);
  smaxOccurs._M_dataplus._M_p = (pointer)&smaxOccurs.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&smaxOccurs,pcVar10,pcVar8);
  std::operator+(&soptional,&sminOccurs,&smaxOccurs);
  if (nillable) {
    pcVar11 = " nillable=\"true\"";
  }
  snillable._M_dataplus._M_p = (pointer)&snillable.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&snillable,pcVar11,pcVar11 + (ulong)nillable * 0x10);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if (((char)iVar4 == '\0') &&
     (iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype), (char)iVar4 == '\0')) {
    if (attrs == (t_struct *)0x0) {
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:element name=\"",0x13);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," type=\"",7);
      type_name_abi_cxx11_(&subname,this,ttype);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,subname._M_dataplus._M_p,subname._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,soptional._M_dataplus._M_p,soptional._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,snillable._M_dataplus._M_p,snillable._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," />",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subname._M_dataplus._M_p != &subname.field_2) {
        operator_delete(subname._M_dataplus._M_p);
      }
    }
    else {
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:element name=\"",0x13);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,soptional._M_dataplus._M_p,soptional._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,snillable._M_dataplus._M_p,snillable._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,">",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:complexType>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:complexContent>",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:extension base=\"",0x15);
      type_name_abi_cxx11_(&subname,this,ttype);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,subname._M_dataplus._M_p,subname._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subname._M_dataplus._M_p != &subname.field_2) {
        operator_delete(subname._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      pptVar7 = (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pptVar7 !=
          (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          poVar5 = t_generator::indent(&this->super_t_generator,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:attribute name=\"",0x15);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar7)->name_)._M_dataplus._M_p,
                              ((*pptVar7)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" type=\"",8);
          type_name_abi_cxx11_(&subname,this,(*pptVar7)->type_);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,subname._M_dataplus._M_p,subname._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" />",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subname._M_dataplus._M_p != &subname.field_2) {
            operator_delete(subname._M_dataplus._M_p);
          }
          pptVar7 = pptVar7 + 1;
        } while (pptVar7 !=
                 (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</xsd:extension>",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</xsd:complexContent>",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</xsd:complexType>",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</xsd:element>",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    goto LAB_0036b45a;
  }
  poVar5 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:element name=\"",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,soptional._M_dataplus._M_p,soptional._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,snillable._M_dataplus._M_p,snillable._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if ((attrs == (t_struct *)0x0) &&
     (iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype), (char)iVar4 != '\0')) {
    poVar5 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:complexType />",0x13);
  }
  else {
    poVar5 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:complexType>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar4 != '\0') {
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"<xsd:sequence minOccurs=\"0\" maxOccurs=\"unbounded\">",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      subname._M_string_length = 0;
      subname.field_2._M_local_buf[0] = '\0';
      ttype_00 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      subname._M_dataplus._M_p = (pointer)&subname.field_2;
      iVar4 = (*(ttype_00->super_t_doc)._vptr_t_doc[5])(ttype_00);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(ttype_00->super_t_doc)._vptr_t_doc[0xd])(ttype_00), (char)iVar4 == '\0')) {
        type_name_abi_cxx11_(&local_b0,this,ttype_00);
        std::__cxx11::string::operator=((string *)&subname,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_0036b143:
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      else {
        pcVar2 = (name->_M_dataplus)._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_b0);
        std::__cxx11::string::operator=((string *)&subname,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_0036b143;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_php_,"$GLOBALS[\'",10);
      ptVar3 = (this->super_t_generator).program_;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->f_php_,(ptVar3->name_)._M_dataplus._M_p,
                          (ptVar3->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_xsd_elt_",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'] = \'",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,subname._M_dataplus._M_p,subname._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\';",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,subname._M_dataplus._M_p,
                 subname._M_dataplus._M_p + subname._M_string_length);
      generate_element(this,out,&local_50,ttype_00,(t_struct *)0x0,false,false,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</xsd:sequence>",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"<xsd:attribute name=\"list\" type=\"xsd:boolean\" />",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subname._M_dataplus._M_p != &subname.field_2) {
        operator_delete(subname._M_dataplus._M_p);
      }
    }
    if ((attrs != (t_struct *)0x0) &&
       (pptVar7 = (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       pptVar7 !=
       (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      do {
        poVar5 = t_generator::indent(&this->super_t_generator,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<xsd:attribute name=\"",0x15);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar7)->name_)._M_dataplus._M_p,
                            ((*pptVar7)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" type=\"",8);
        type_name_abi_cxx11_(&subname,this,(*pptVar7)->type_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,subname._M_dataplus._M_p,subname._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" />",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)subname._M_dataplus._M_p != &subname.field_2) {
          operator_delete(subname._M_dataplus._M_p);
        }
        pptVar7 = pptVar7 + 1;
      } while (pptVar7 !=
               (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</xsd:complexType>",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</xsd:element>",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_0036b45a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)snillable._M_dataplus._M_p != &snillable.field_2) {
    operator_delete(snillable._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)soptional._M_dataplus._M_p != &soptional.field_2) {
    operator_delete(soptional._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)smaxOccurs._M_dataplus._M_p != &smaxOccurs.field_2) {
    operator_delete(smaxOccurs._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sminOccurs._M_dataplus._M_p != &sminOccurs.field_2) {
    operator_delete(sminOccurs._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_xsd_generator::generate_element(ostream& out,
                                       string name,
                                       t_type* ttype,
                                       t_struct* attrs,
                                       bool optional,
                                       bool nillable,
                                       bool list_element) {
  string sminOccurs = (optional || list_element) ? " minOccurs=\"0\"" : "";
  string smaxOccurs = list_element ? " maxOccurs=\"unbounded\"" : "";
  string soptional = sminOccurs + smaxOccurs;
  string snillable = nillable ? " nillable=\"true\"" : "";

  if (ttype->is_void() || ttype->is_list()) {
    indent(out) << "<xsd:element name=\"" << name << "\"" << soptional << snillable << ">" << endl;
    indent_up();
    if (attrs == nullptr && ttype->is_void()) {
      indent(out) << "<xsd:complexType />" << endl;
    } else {
      indent(out) << "<xsd:complexType>" << endl;
      indent_up();
      if (ttype->is_list()) {
        indent(out) << "<xsd:sequence minOccurs=\"0\" maxOccurs=\"unbounded\">" << endl;
        indent_up();
        string subname;
        t_type* subtype = ((t_list*)ttype)->get_elem_type();
        if (subtype->is_base_type() || subtype->is_container()) {
          subname = name + "_elt";
        } else {
          subname = type_name(subtype);
        }
        f_php_ << "$GLOBALS['" << program_->get_name() << "_xsd_elt_" << name << "'] = '" << subname
               << "';" << endl;
        generate_element(out, subname, subtype, nullptr, false, false, true);
        indent_down();
        indent(out) << "</xsd:sequence>" << endl;
        indent(out) << "<xsd:attribute name=\"list\" type=\"xsd:boolean\" />" << endl;
      }
      if (attrs != nullptr) {
        const vector<t_field*>& members = attrs->get_members();
        vector<t_field*>::const_iterator a_iter;
        for (a_iter = members.begin(); a_iter != members.end(); ++a_iter) {
          indent(out) << "<xsd:attribute name=\"" << (*a_iter)->get_name() << "\" type=\""
                      << type_name((*a_iter)->get_type()) << "\" />" << endl;
        }
      }
      indent_down();
      indent(out) << "</xsd:complexType>" << endl;
    }
    indent_down();
    indent(out) << "</xsd:element>" << endl;
  } else {
    if (attrs == nullptr) {
      indent(out) << "<xsd:element name=\"" << name << "\""
                  << " type=\"" << type_name(ttype) << "\"" << soptional << snillable << " />"
                  << endl;
    } else {
      // Wow, all this work for a SIMPLE TYPE with attributes?!?!?!
      indent(out) << "<xsd:element name=\"" << name << "\"" << soptional << snillable << ">"
                  << endl;
      indent_up();
      indent(out) << "<xsd:complexType>" << endl;
      indent_up();
      indent(out) << "<xsd:complexContent>" << endl;
      indent_up();
      indent(out) << "<xsd:extension base=\"" << type_name(ttype) << "\">" << endl;
      indent_up();
      const vector<t_field*>& members = attrs->get_members();
      vector<t_field*>::const_iterator a_iter;
      for (a_iter = members.begin(); a_iter != members.end(); ++a_iter) {
        indent(out) << "<xsd:attribute name=\"" << (*a_iter)->get_name() << "\" type=\""
                    << type_name((*a_iter)->get_type()) << "\" />" << endl;
      }
      indent_down();
      indent(out) << "</xsd:extension>" << endl;
      indent_down();
      indent(out) << "</xsd:complexContent>" << endl;
      indent_down();
      indent(out) << "</xsd:complexType>" << endl;
      indent_down();
      indent(out) << "</xsd:element>" << endl;
    }
  }
}